

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PFlushLineImpl(TidyDocImpl *doc)

{
  int iVar1;
  int spaces;
  Bool BVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar1 = (doc->pprint).indent[0].spaces;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  if ((doc->config).value[0x5d].v <= (ulong)(iVar4 + (doc->pprint).linelen)) {
    WrapLine(doc);
  }
  BVar2 = WantIndent(doc);
  if (BVar2 != no) {
    WriteIndentChar(doc);
  }
  if ((doc->pprint).linelen == 0) {
    uVar3 = 0;
  }
  else {
    uVar5 = 0;
    do {
      prvTidyWriteChar((doc->pprint).linebuf[uVar5],doc->docOut);
      uVar5 = uVar5 + 1;
      uVar3 = (doc->pprint).linelen;
    } while (uVar5 < uVar3);
  }
  iVar1 = (doc->pprint).indent[0].attrStringStart;
  if (iVar1 < (int)uVar3 && -1 < iVar1) {
    prvTidyWriteChar(0x5c,doc->docOut);
  }
  ResetLine(&doc->pprint);
  (doc->pprint).linelen = 0;
  return;
}

Assistant:

static void PFlushLineImpl( TidyDocImpl* doc )
{
    TidyPrintImpl* pprint = &doc->pprint;

    uint i;

    CheckWrapLine( doc );

    if ( WantIndent(doc) )
        WriteIndentChar(doc);

    for ( i = 0; i < pprint->linelen; ++i )
        TY_(WriteChar)( pprint->linebuf[i], doc->docOut );

    if ( IsInString(pprint) )
        TY_(WriteChar)( '\\', doc->docOut );
    ResetLine( pprint );
    pprint->linelen = 0;
}